

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdRootNodeHasCommonVars(Kit_DsdObj_t *pObj0,Kit_DsdObj_t *pObj1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if ((uint)*pObj0 >> 0x1a <= uVar5) {
      return 0;
    }
    uVar1 = Abc_Lit2Var((uint)*(ushort *)(&pObj0[1].field_0x0 + uVar5 * 2));
    if (uVar1 < 4) {
      uVar4 = 0;
      while (uVar4 < (uint)*pObj1 >> 0x1a) {
        iVar2 = Abc_Lit2Var((uint)*(ushort *)(&pObj0[1].field_0x0 + uVar5 * 2));
        iVar3 = Abc_Lit2Var((uint)*(ushort *)(&pObj1[1].field_0x0 + uVar4 * 2));
        uVar4 = uVar4 + 1;
        if (iVar2 == iVar3) {
          return 1;
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Kit_DsdRootNodeHasCommonVars( Kit_DsdObj_t * pObj0, Kit_DsdObj_t * pObj1 )
{
    unsigned i, k;
    for ( i = 0; i < pObj0->nFans; i++ )
    {
        if ( Abc_Lit2Var(pObj0->pFans[i]) >= 4 )
            continue;
        for ( k = 0; k < pObj1->nFans; k++ )
            if ( Abc_Lit2Var(pObj0->pFans[i]) == Abc_Lit2Var(pObj1->pFans[k]) )
                return 1;
    }
    return 0;
}